

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  _GLFWwindow *window;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  else if (attrib == 0x20001) {
    handle_local._4_4_ = (uint)((_GLFWwindow *)handle == _glfw.focusedWindow);
  }
  else if (attrib == 0x20002) {
    handle_local._4_4_ = (uint)(byte)handle[8];
  }
  else if (attrib == 0x20003) {
    handle_local._4_4_ = (uint)(byte)handle[9];
  }
  else if (attrib == 0x20004) {
    handle_local._4_4_ = (uint)(byte)handle[0xb];
  }
  else if (attrib == 0x20005) {
    handle_local._4_4_ = (uint)(byte)handle[10];
  }
  else if (attrib == 0x22001) {
    handle_local._4_4_ = *(uint *)(handle + 0x1bc);
  }
  else if (attrib == 0x22002) {
    handle_local._4_4_ = *(uint *)(handle + 0x1c0);
  }
  else if (attrib == 0x22003) {
    handle_local._4_4_ = *(uint *)(handle + 0x1c4);
  }
  else if (attrib == 0x22004) {
    handle_local._4_4_ = *(uint *)(handle + 0x1c8);
  }
  else if (attrib == 0x22005) {
    handle_local._4_4_ = *(uint *)(handle + 0x1d4);
  }
  else if (attrib == 0x22006) {
    handle_local._4_4_ = (uint)(byte)handle[0x1cc];
  }
  else if (attrib == 0x22007) {
    handle_local._4_4_ = (uint)(byte)handle[0x1cd];
  }
  else if (attrib == 0x22008) {
    handle_local._4_4_ = *(uint *)(handle + 0x1d0);
  }
  else {
    _glfwInputError(0x10003,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return window == _glfw.focusedWindow;
        case GLFW_ICONIFIED:
            return window->iconified;
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_VISIBLE:
            return window->visible;
        case GLFW_CLIENT_API:
            return window->clientAPI;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->glMajor;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->glMinor;
        case GLFW_CONTEXT_REVISION:
            return window->glRevision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->glRobustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->glForward;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            return window->glDebug;
        case GLFW_OPENGL_PROFILE:
            return window->glProfile;
    }

    _glfwInputError(GLFW_INVALID_ENUM, NULL);
    return 0;
}